

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.h
# Opt level: O0

void __thiscall L13_3::BankAccount::~BankAccount(BankAccount *this)

{
  BankAccount *this_local;
  
  ~BankAccount(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~BankAccount(){}